

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O2

_Bool mptest_el_access2(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    if (uVar6 == 1000) break;
    iVar3 = rand();
    iVar4 = rand();
    bVar1 = Ml->e[(long)(iVar4 % ncol) + Ml->rstride * (long)(iVar3 % nrow)];
    uVar5 = m2v_get_el(Ms,iVar3 % nrow,iVar4 % ncol);
    uVar2 = uVar6 + 1;
  } while (uVar5 == bVar1);
  return 999 < uVar6;
}

Assistant:

static bool mptest_el_access2(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	const int niter = 1000;
	for (int N = 0; N < niter; ++N) {
		const int r = rand() % nrow;
		const int c = rand() % ncol;
		if (m256v_get_el(Ml, r, c) != m2v_get_el(Ms, r, c))
			return false;
	}
	return true;
}